

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<float>::SolveSOR
          (TPZMatrix<float> *this,int64_t *numiterations,TPZFMatrix<float> *F,
          TPZFMatrix<float> *result,TPZFMatrix<float> *residual,TPZFMatrix<float> *param_5,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t j;
  long lVar9;
  long lVar10;
  bool bVar11;
  float fVar12;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float local_98;
  long lVar4;
  
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  if (residual == (TPZFMatrix<float> *)0x0) {
    fVar12 = (float)*tol + (float)*tol + 1.0;
  }
  else {
    fVar12 = Dot<float>(residual,residual);
    if (fVar12 < 0.0) {
      fVar12 = sqrtf(fVar12);
    }
    else {
      fVar12 = SQRT(fVar12);
    }
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (result);
  }
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar4 = CONCAT44(extraout_var,iVar3);
  lVar10 = 0;
  bVar11 = direction != -1;
  lVar5 = lVar4 + -1;
  if (bVar11) {
    lVar5 = lVar10;
  }
  lVar6 = -1;
  if (bVar11) {
    lVar6 = lVar4;
  }
  if (0 < *numiterations) {
    lVar1 = (F->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
    lVar10 = 0;
    do {
      if ((double)ABS(fVar12) <= ABS(*tol)) break;
      if (lVar1 < 1) {
        fVar12 = 0.0;
      }
      else {
        fVar12 = 0.0;
        lVar7 = 0;
        lVar8 = 0;
        lVar2 = lVar5;
        do {
          for (; lVar2 != lVar6; lVar2 = lVar2 + (ulong)bVar11 * 2 + -1) {
            (*(F->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0x24])(F,lVar2,lVar8);
            local_98 = extraout_XMM0_Da;
            if (0 < lVar4) {
              lVar9 = 0;
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar2,lVar9);
                if (((result->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow <= lVar9) ||
                   ((result->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol <= lVar8)) {
                  TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_98 = local_98 -
                           extraout_XMM0_Da_00 *
                           *(float *)((long)result->fElem +
                                     lVar9 * 4 +
                                     (result->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow *
                                     lVar7);
                lVar9 = lVar9 + 1;
              } while (lVar4 != lVar9);
            }
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar2,lVar2)
            ;
            if (((lVar2 < 0) || ((result->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow <= lVar2)
                ) || ((result->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol <= lVar8)) {
              TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar9 = (result->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow * lVar8;
            fVar12 = fVar12 + local_98 * local_98;
            result->fElem[lVar9 + lVar2] =
                 (local_98 * (float)overrelax) / extraout_XMM0_Da_01 + result->fElem[lVar9 + lVar2];
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 4;
          lVar2 = lVar5;
        } while (lVar8 != lVar1);
      }
      if (fVar12 < 0.0) {
        fVar12 = sqrtf(fVar12);
      }
      else {
        fVar12 = SQRT(fVar12);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < *numiterations);
  }
  if (residual != (TPZFMatrix<float> *)0x0) {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F,residual);
  }
  *numiterations = lVar10;
  *tol = (double)ABS(fVar12);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}